

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O1

void __thiscall
kainjow::mustache::
basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
basic_lambda_t(basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,basic_lambda_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *l)

{
  unique_ptr<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>_>
  *this_00;
  _Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_*,_false>
  _Var1;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
  *__x;
  _Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_*,_false>
  __ptr_00;
  _Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_*,_false>
  this_01;
  _Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_*,_false>
  this_02;
  pointer *__ptr_1;
  pointer *__ptr;
  
  this_00 = &this->type2_;
  (this->type1_)._M_t.
  super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
  .
  super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_*,_false>
  ._M_head_impl =
       (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        *)0x0;
  (this->type2_)._M_t.
  super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>_>
  .
  super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_*,_false>
  ._M_head_impl =
       (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
        *)0x0;
  _Var1._M_head_impl =
       (l->type1_)._M_t.
       super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
       .
       super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_*,_false>
       ._M_head_impl;
  if (_Var1._M_head_impl ==
      (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
       *)0x0) {
    __x = (l->type2_)._M_t.
          super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>_>
          .
          super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_*,_false>
          ._M_head_impl;
    if (__x != (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
                *)0x0) {
      this_02._M_head_impl =
           (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
            *)operator_new(0x20);
      Catch::clara::std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
      ::function(this_02._M_head_impl,__x);
      __ptr_00._M_head_impl =
           (this_00->_M_t).
           super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>_>
           .
           super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_*,_false>
           ._M_head_impl;
      (this_00->_M_t).
      super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>_>
      .
      super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_*,_false>
      ._M_head_impl = this_02._M_head_impl;
      if (__ptr_00._M_head_impl !=
          (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>
           *)0x0) {
        Catch::clara::std::
        default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>
        ::operator()((default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_kainjow::mustache::basic_renderer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&)>_>
                      *)this_00,__ptr_00._M_head_impl);
        return;
      }
    }
  }
  else {
    this_01._M_head_impl =
         (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *)operator_new(0x20);
    Catch::clara::std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::function(this_01._M_head_impl,_Var1._M_head_impl);
    _Var1._M_head_impl =
         (this->type1_)._M_t.
         super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
         .
         super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_*,_false>
         ._M_head_impl;
    (this->type1_)._M_t.
    super___uniq_ptr_impl<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_*,_std::default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
    .
    super__Head_base<0UL,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_*,_false>
    ._M_head_impl = this_01._M_head_impl;
    if (_Var1._M_head_impl !=
        (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
         *)0x0) {
      Catch::clara::std::
      default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      ::operator()((default_delete<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                    *)this,_Var1._M_head_impl);
      return;
    }
  }
  return;
}

Assistant:

basic_lambda_t(const basic_lambda_t& l) {
        if (l.type1_) {
            type1_.reset(new type1(*l.type1_));
        } else if (l.type2_) {
            type2_.reset(new type2(*l.type2_));
        }
    }